

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O2

int arkInterpUpdate_Lagrange(ARKodeMem_conflict ark_mem,ARKInterp I,sunrealtype tnew)

{
  int iVar1;
  int *piVar2;
  undefined8 *puVar3;
  double *pdVar4;
  undefined8 uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  double dVar9;
  double dVar10;
  
  piVar2 = (int *)I->content;
  iVar8 = piVar2[6];
  iVar1 = *piVar2;
  puVar3 = *(undefined8 **)(piVar2 + 2);
  pdVar4 = *(double **)(piVar2 + 4);
  dVar9 = (ABS(ark_mem->h) + ABS(ark_mem->tcur)) * ark_mem->uround * 100.0;
  *(double *)(piVar2 + 8) = dVar9;
  dVar10 = ABS(tnew - *pdVar4);
  for (lVar6 = 1; lVar6 < iVar8; lVar6 = lVar6 + 1) {
    if (ABS(tnew - pdVar4[lVar6]) <= dVar10) {
      dVar10 = ABS(tnew - pdVar4[lVar6]);
    }
  }
  if (dVar9 < dVar10) {
    uVar5 = puVar3[(long)iVar1 + -1];
    for (uVar7 = (long)iVar1 - 1U & 0xffffffff; 0 < (int)uVar7; uVar7 = uVar7 - 1) {
      pdVar4[uVar7] = pdVar4[uVar7 - 1];
      puVar3[uVar7] = puVar3[uVar7 - 1];
    }
    *puVar3 = uVar5;
    *pdVar4 = tnew;
    N_VScale(0x3ff0000000000000,ark_mem->ycur);
    iVar8 = iVar8 + 1;
    if (iVar1 <= iVar8) {
      iVar8 = iVar1;
    }
    *(int *)((long)I->content + 0x18) = iVar8;
  }
  return 0;
}

Assistant:

int arkInterpUpdate_Lagrange(ARKodeMem ark_mem, ARKInterp I, sunrealtype tnew)
{
  int i;
  sunrealtype tdiff;
  N_Vector ytmp;
  int nhist, nmax;
  sunrealtype* thist;
  N_Vector* yhist;

  /* set readability shortcuts */
  nhist = LINT_NHIST(I);
  nmax  = LINT_NMAX(I);
  thist = LINT_THIST(I);
  yhist = LINT_YHIST(I);

  /* update t roundoff value */
  LINT_TROUND(I) = FUZZ_FACTOR * ark_mem->uround *
                   (SUNRabs(ark_mem->tcur) + SUNRabs(ark_mem->h));

  /* determine if tnew differs sufficiently from stored values */
  tdiff = SUNRabs(tnew - thist[0]);
  for (i = 1; i < nhist; i++)
  {
    tdiff = SUNMIN(tdiff, SUNRabs(tnew - thist[i]));
  }
  if (tdiff <= LINT_TROUND(I)) { return (ARK_SUCCESS); }

  /* shift (t,y) history arrays by one */
  ytmp = yhist[nmax - 1];
  for (i = nmax - 1; i > 0; i--)
  {
    thist[i] = thist[i - 1];
    yhist[i] = yhist[i - 1];
  }
  yhist[0] = ytmp;

  /* copy tnew and ycur into first entry of history arrays */
  thist[0] = tnew;
  N_VScale(ONE, ark_mem->ycur, yhist[0]);

  /* update 'nhist' (first few steps) */
  LINT_NHIST(I) = nhist = SUNMIN(nhist + 1, nmax);

  /* return with success */
  return (ARK_SUCCESS);
}